

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::operator==
          (Dynamic_Object_Function *this,Proxy_Function_Base *f)

{
  __type_conflict1 _Var1;
  undefined1 uVar2;
  long lVar3;
  
  lVar3 = __dynamic_cast(f,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (lVar3 != 0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar3 + 0x28),&this->m_type_name);
    if (_Var1) {
      uVar2 = (**(code **)(**(long **)(lVar3 + 0x48) + 0x10))
                        (*(long **)(lVar3 + 0x48),
                         (this->m_func).
                         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &f) const CHAISCRIPT_OVERRIDE
          {
            if (const auto *df = dynamic_cast<const Dynamic_Object_Function *>(&f))
            {
              return df->m_type_name == m_type_name && (*df->m_func) == (*m_func);
            } else {
              return false;
            }
          }